

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

uint64_t internal_rle_compress(void *out,uint64_t outbytes,void *src,uint64_t srcbytes)

{
  bool bVar1;
  int8_t *piVar2;
  long lVar3;
  uint8_t curcount;
  uint64_t outb;
  int8_t *rune;
  int8_t *end;
  int8_t *runs;
  int8_t *cbuf;
  uint64_t srcbytes_local;
  void *src_local;
  uint64_t outbytes_local;
  void *out_local;
  
  piVar2 = (int8_t *)((long)src + srcbytes);
  rune = (int8_t *)((long)src + 1);
  outb = 0;
  runs = (int8_t *)src;
  do {
    if (piVar2 <= runs) {
      return outb;
    }
    curcount = '\0';
    while( true ) {
      bVar1 = false;
      if ((rune < piVar2) && (bVar1 = false, *runs == *rune)) {
        bVar1 = curcount < 0x7f;
      }
      if (!bVar1) break;
      rune = rune + 1;
      curcount = curcount + '\x01';
    }
    if (curcount < 2) {
      while( true ) {
        curcount = curcount + '\x01';
        bVar1 = false;
        if ((rune < piVar2) &&
           ((((piVar2 <= rune + 1 || (*rune != rune[1])) || (piVar2 <= rune + 2)) ||
            (bVar1 = false, rune[1] != rune[2])))) {
          bVar1 = curcount < 0x7f;
        }
        if (!bVar1) break;
        rune = rune + 1;
      }
      *(uint8_t *)((long)out + outb) = -curcount;
      while (outb = outb + 1, runs < rune) {
        *(int8_t *)((long)out + outb) = *runs;
        runs = runs + 1;
      }
    }
    else {
      lVar3 = outb + 1;
      *(uint8_t *)((long)out + outb) = curcount;
      outb = outb + 2;
      *(int8_t *)((long)out + lVar3) = *runs;
      runs = rune;
    }
    rune = rune + 1;
  } while (outb < outbytes);
  return outb;
}

Assistant:

uint64_t
internal_rle_compress (
    void* out, uint64_t outbytes, const void* src, uint64_t srcbytes)
{
    int8_t*       cbuf = out;
    const int8_t* runs = src;
    const int8_t* end  = runs + srcbytes;
    const int8_t* rune = runs + 1;
    uint64_t      outb = 0;

    while (runs < end)
    {
        uint8_t curcount = 0;
        while (rune < end && *runs == *rune && curcount < MAX_RUN_LENGTH)
        {
            ++rune;
            ++curcount;
        }

        if (curcount >= (MIN_RUN_LENGTH - 1))
        {
            cbuf[outb++] = (int8_t) curcount;
            cbuf[outb++] = *runs;

            runs = rune;
        }
        else
        {
            /* incompressible */
            ++curcount;
            while (rune < end &&
                   ((rune + 1 >= end || *rune != *(rune + 1)) ||
                    (rune + 2 >= end || *(rune + 1) != *(rune + 2))) &&
                   curcount < MAX_RUN_LENGTH)
            {
                ++curcount;
                ++rune;
            }
            cbuf[outb++] = (int8_t) (-((int) curcount));
            while (runs < rune)
                cbuf[outb++] = *runs++;
        }
        ++rune;
        if (outb >= outbytes) break;
    }
    return outb;
}